

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

void __thiscall correctness_negation_int_min_Test::TestBody(correctness_negation_int_min_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  big_integer b;
  big_integer a;
  int local_134;
  internal local_130 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  big_integer local_120;
  big_integer local_e8;
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_40,-0x80000000);
  big_integer::operator-(&local_78,&local_40);
  local_134 = 0x7fffffff;
  big_integer::big_integer(&local_b0,&local_78);
  big_integer::big_integer(&local_e8,1);
  operator-(&local_120,&local_b0,&local_e8);
  testing::internal::CmpHelperEQ<int,big_integer>
            (local_130,"std::numeric_limits<int>::max()","b - 1",&local_134,&local_120);
  big_integer::~big_integer(&local_120);
  big_integer::~big_integer(&local_e8);
  big_integer::~big_integer(&local_b0);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_128.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_128.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x12d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_120._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_120._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_120._0_8_ + 8))();
      }
      local_120._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  big_integer::~big_integer(&local_40);
  return;
}

Assistant:

TEST(correctness, negation_int_min)
{
    big_integer a = std::numeric_limits<int>::min();
    big_integer b = -a;

    EXPECT_EQ(std::numeric_limits<int>::max(), b - 1);
}